

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O2

bool S2::FaceXYZtoUV(int face,S2Point *p,double *pu,double *pv)

{
  double dVar1;
  
  if (face < 3) {
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,face);
    if (0.0 < dVar1) {
LAB_0021c29b:
      ValidFaceXYZtoUV(face,p,pu,pv);
      return true;
    }
  }
  else {
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                      ((BasicVector<Vector3,_double,_3UL> *)p,face + -3);
    if (dVar1 < 0.0) goto LAB_0021c29b;
  }
  return false;
}

Assistant:

inline bool FaceXYZtoUV(int face, const S2Point& p,
                        double* pu, double* pv) {
  if (face < 3) {
    if (p[face] <= 0) return false;
  } else {
    if (p[face-3] >= 0) return false;
  }
  ValidFaceXYZtoUV(face, p, pu, pv);
  return true;
}